

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::anon_unknown_13::TileProcess::run_decode
          (TileProcess *this,exr_const_context_t ctxt,int pn,FrameBuffer *outfb,
          vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *filllist)

{
  TileProcess *pTVar1;
  undefined8 *puVar2;
  TileProcess TVar3;
  bool bVar4;
  PixelType PVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  pointer pSVar9;
  char cVar10;
  exr_const_context_t p_Var11;
  ushort uVar12;
  int iVar13;
  Slice *pSVar14;
  ulong uVar15;
  ArgExc *this_00;
  float fVar16;
  long lVar17;
  code *pcVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  undefined *puVar24;
  long lVar25;
  pointer pSVar26;
  long lVar27;
  ulong uVar28;
  float *pfVar29;
  float *pfVar30;
  long lVar31;
  int tileY;
  int tileX;
  exr_attr_box2i_t dw;
  int local_68;
  int local_58;
  int local_54;
  vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *local_50;
  exr_const_context_t local_48;
  int local_40;
  int local_3c;
  
  TVar3 = *this;
  pTVar1 = this + 0x48;
  if (TVar3 == (TileProcess)0x1) {
    iVar13 = exr_decoding_initialize();
    if (iVar13 == 0) {
      *this = (TileProcess)0x0;
LAB_001a5685:
      iVar13 = exr_get_data_window(ctxt,pn,&local_40);
      if (iVar13 == 0) {
        local_50 = filllist;
        local_48 = ctxt;
        iVar13 = exr_get_tile_sizes(ctxt,pn,this[0x1c],this[0x1d],&local_54,&local_58);
        if (iVar13 == 0) {
          lVar17 = (long)*(int *)(this + 0xc) * (long)local_54 + (long)local_40;
          lVar27 = (long)*(int *)(this + 0x10) * (long)local_58 + (long)local_3c;
          *(undefined8 *)(this + 0xa8) = 0;
          if (0 < *(short *)(this + 0x58)) {
            lVar20 = 0x28;
            lVar31 = 0;
            do {
              lVar6 = *(long *)(this + 0x50);
              pSVar14 = FrameBuffer::findSlice(outfb,*(char **)(lVar6 + -0x28 + lVar20));
              if ((pSVar14 == (Slice *)0x0) || (*(int *)(lVar6 + -0x20 + lVar20) == 0)) {
                puVar2 = (undefined8 *)(lVar6 + -8 + lVar20);
                *puVar2 = 0;
                puVar2[1] = 0;
              }
              else {
                if ((pSVar14->xSampling != 1) || (pSVar14->ySampling != 1)) {
                  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                  Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
                  goto LAB_001a5a10;
                }
                PVar5 = pSVar14->type;
                lVar22 = lVar17;
                if (pSVar14->xTileCoords != false) {
                  lVar22 = 0;
                }
                bVar4 = pSVar14->yTileCoords;
                *(ushort *)(lVar6 + -0xc + lVar20) = (ushort)(PVar5 != HALF) * 2 + 2;
                *(short *)(lVar6 + -10 + lVar20) = (short)PVar5;
                sVar7 = pSVar14->xStride;
                *(int *)(lVar6 + -8 + lVar20) = (int)sVar7;
                sVar8 = pSVar14->yStride;
                lVar25 = lVar27;
                if (bVar4 != false) {
                  lVar25 = 0;
                }
                *(int *)(lVar6 + -4 + lVar20) = (int)sVar8;
                *(char **)(lVar6 + lVar20) = pSVar14->base + lVar25 * sVar8 + lVar22 * sVar7;
              }
              lVar31 = lVar31 + 1;
              lVar20 = lVar20 + 0x30;
            } while (lVar31 < *(short *)(this + 0x58));
          }
          p_Var11 = local_48;
          if ((TVar3 == (TileProcess)0x0) ||
             (iVar13 = exr_decoding_choose_default_routines(local_48,pn,pTVar1), iVar13 == 0)) {
            iVar13 = exr_decoding_run(p_Var11,pn,pTVar1);
            if (iVar13 == 0) {
              pSVar26 = (local_50->
                        super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>)._M_impl
                        .super__Vector_impl_data._M_start;
              pSVar9 = (local_50->
                       super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              if (pSVar26 != pSVar9) {
                local_68 = (int)lVar17;
                do {
                  if ((pSVar26->xSampling != 1) || (pSVar26->ySampling != 1)) {
                    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
                    goto LAB_001a5a10;
                  }
                  iVar13 = *(int *)(this + 0x14);
                  if (0 < iVar13) {
                    uVar23 = 0;
                    uVar15 = (long)local_68;
                    if (pSVar26->xTileCoords != false) {
                      uVar15 = uVar23;
                    }
                    sVar7 = pSVar26->xStride;
                    sVar8 = pSVar26->yStride;
                    uVar28 = (long)(int)lVar27;
                    if (pSVar26->yTileCoords != false) {
                      uVar28 = uVar23;
                    }
                    pfVar29 = (float *)(pSVar26->base + uVar28 * sVar8 + uVar15 * sVar7);
                    do {
                      if ((int)uVar23 % pSVar26->ySampling == 0) {
                        iVar19 = *(int *)(this + 0x18);
                        if (0 < iVar19) {
                          iVar13 = 0;
                          pfVar30 = pfVar29;
                          do {
                            if (iVar13 % pSVar26->xSampling == 0) {
                              PVar5 = pSVar26->type;
                              if (PVar5 == FLOAT) {
                                *pfVar30 = (float)pSVar26->fillValue;
                              }
                              else if (PVar5 == HALF) {
                                fVar16 = ABS((float)pSVar26->fillValue);
                                uVar12 = (ushort)((uint)(float)pSVar26->fillValue >> 0x10) & 0x8000;
                                if ((uint)fVar16 < 0x38800000) {
                                  if ((0x33000000 < (uint)fVar16) &&
                                     (uVar21 = (uint)fVar16 & 0x7fffff | 0x800000,
                                     cVar10 = (char)((uint)fVar16 >> 0x17),
                                     uVar12 = uVar12 | (ushort)(uVar21 >> (0x7eU - cVar10 & 0x1f)),
                                     0x80000000 < uVar21 << (cVar10 + 0xa2U & 0x1f))) {
                                    uVar12 = uVar12 + 1;
                                  }
                                }
                                else if ((uint)fVar16 < 0x7f800000) {
                                  if ((uint)fVar16 < 0x477ff000) {
                                    uVar12 = (ushort)((int)fVar16 + 0x8000fff +
                                                      (uint)(((uint)fVar16 >> 0xd & 1) != 0) >> 0xd)
                                             | uVar12;
                                  }
                                  else {
                                    uVar12 = uVar12 | 0x7c00;
                                  }
                                }
                                else {
                                  uVar12 = uVar12 | 0x7c00;
                                  if (fVar16 != INFINITY) {
                                    uVar21 = (uint)fVar16 >> 0xd & 0x3ff;
                                    uVar12 = uVar12 | (ushort)uVar21 | (ushort)(uVar21 == 0);
                                  }
                                }
                                *(ushort *)pfVar30 = uVar12;
                              }
                              else {
                                if (PVar5 != UINT) {
                                  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                                  Iex_3_4::ArgExc::ArgExc(this_00,"Unknown pixel data type.");
                                  goto LAB_001a5a10;
                                }
                                *pfVar30 = (float)(long)pSVar26->fillValue;
                                iVar19 = *(int *)(this + 0x18);
                              }
                              pfVar30 = (float *)((long)pfVar30 + sVar7);
                            }
                            iVar13 = iVar13 + 1;
                          } while (iVar13 < iVar19);
                          iVar13 = *(int *)(this + 0x14);
                        }
                        pfVar29 = (float *)((long)pfVar29 + sVar8);
                      }
                      uVar21 = (int)uVar23 + 1;
                      uVar23 = (ulong)uVar21;
                    } while ((int)uVar21 < iVar13);
                  }
                  pSVar26 = pSVar26 + 1;
                } while (pSVar26 != pSVar9);
              }
              return;
            }
            this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to run decoder");
          }
          else {
            this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to choose decoder routines");
          }
          goto LAB_001a5b17;
        }
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query the data window.");
      }
      else {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query the data window.");
      }
LAB_001a5a10:
      puVar24 = &Iex_3_4::ArgExc::typeinfo;
      pcVar18 = Iex_3_4::ArgExc::~ArgExc;
      goto LAB_001a5a1e;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to initialize decode pipeline");
  }
  else {
    iVar13 = exr_decoding_update(ctxt,pn,this + 8,pTVar1);
    if (iVar13 == 0) goto LAB_001a5685;
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc((IoExc *)this_00,"Unable to update decode pipeline");
  }
LAB_001a5b17:
  puVar24 = &Iex_3_4::IoExc::typeinfo;
  pcVar18 = Iex_3_4::IoExc::~IoExc;
LAB_001a5a1e:
  __cxa_throw(this_00,puVar24,pcVar18);
}

Assistant:

void TileProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const FrameBuffer *outfb,
    const std::vector<Slice> &filllist)
{
    int absX, absY, tileX, tileY;
    exr_attr_box2i_t dw;

    // stash the flag off to make sure to clean up in the event
    // of an exception by changing the flag after init...
    bool isfirst = first;
    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }

        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
    }

    if (EXR_ERR_SUCCESS != exr_get_data_window (ctxt, pn, &dw))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    if (EXR_ERR_SUCCESS != exr_get_tile_sizes (
            ctxt, pn, cinfo.level_x, cinfo.level_y, &tileX, &tileY))
        throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

    absX = dw.min.x + tileX * cinfo.start_x;
    absY = dw.min.y + tileY * cinfo.start_y;

    update_pointers (outfb, dw.min.x, dw.min.y, absX, absY);

    if (isfirst)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    if (EXR_ERR_SUCCESS != exr_decoding_run (ctxt, pn, &decoder))
        throw IEX_NAMESPACE::IoExc ("Unable to run decoder");

    run_fill (outfb, dw.min.x, dw.min.y, absX, absY, filllist);
}